

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

cmJSONHelper<std::nullptr_t,_ReadFileResult> *
cmCMakePresetsGraphInternal::VendorHelper
          (cmJSONHelper<std::nullptr_t,_ReadFileResult> *__return_storage_ptr__,ReadFileResult error
          )

{
  anon_class_4_1_a7dec128 local_18;
  ReadFileResult local_14;
  cmJSONHelper<std::nullptr_t,_ReadFileResult> *pcStack_10;
  ReadFileResult error_local;
  
  local_18.error = error;
  local_14 = error;
  pcStack_10 = __return_storage_ptr__;
  std::function<cmCMakePresetsGraph::ReadFileResult(decltype(nullptr)&,Json::Value_const*)>::
  function<cmCMakePresetsGraphInternal::VendorHelper(cmCMakePresetsGraph::ReadFileResult)::__0,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(decltype(nullptr)&,Json::Value_const*)> *
             )__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

cmJSONHelper<std::nullptr_t, ReadFileResult> VendorHelper(ReadFileResult error)
{
  return [error](std::nullptr_t& /*out*/,
                 const Json::Value* value) -> ReadFileResult {
    if (!value) {
      return ReadFileResult::READ_OK;
    }

    if (!value->isObject()) {
      return error;
    }

    return ReadFileResult::READ_OK;
  };
}